

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenio::save_elements(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  int local_430;
  int local_42c;
  int j;
  int i;
  char outelefilename [1024];
  FILE *fout;
  char *filebasename_local;
  tetgenio *this_local;
  
  sprintf((char *)&j,"%s.ele",filebasename);
  printf("Saving elements to %s\n",&j);
  __stream = fopen((char *)&j,"w");
  if (this->mesh_dim == 3) {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftetrahedra,
            (ulong)(uint)this->numberofcorners,(ulong)(uint)this->numberoftetrahedronattributes);
    for (local_42c = 0; local_42c < this->numberoftetrahedra; local_42c = local_42c + 1) {
      fprintf(__stream,"%d",(ulong)(uint)(local_42c + this->firstnumber));
      for (local_430 = 0; local_430 < this->numberofcorners; local_430 = local_430 + 1) {
        fprintf(__stream,"  %5d",
                (ulong)(uint)this->tetrahedronlist[local_42c * this->numberofcorners + local_430]);
      }
      for (local_430 = 0; local_430 < this->numberoftetrahedronattributes; local_430 = local_430 + 1
          ) {
        fprintf(__stream,"  %g",
                this->tetrahedronattributelist
                [local_42c * this->numberoftetrahedronattributes + local_430]);
      }
      fprintf(__stream,"\n");
    }
  }
  else {
    fprintf(__stream,"%d  %d  %d\n",(ulong)(uint)this->numberoftrifaces,3,
            (ulong)(this->trifacemarkerlist != (int *)0x0));
    for (local_42c = 0; local_42c < this->numberoftrifaces; local_42c = local_42c + 1) {
      fprintf(__stream,"%d",(ulong)(uint)(local_42c + this->firstnumber));
      for (local_430 = 0; local_430 < 3; local_430 = local_430 + 1) {
        fprintf(__stream,"  %5d",(ulong)(uint)this->trifacelist[local_42c * 3 + local_430]);
      }
      if (this->trifacemarkerlist != (int *)0x0) {
        fprintf(__stream,"  %d",(ulong)(uint)this->trifacemarkerlist[local_42c]);
      }
      fprintf(__stream,"\n");
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_elements(char* filebasename)
{
  FILE *fout;
  char outelefilename[FILENAMESIZE];
  int i, j;

  sprintf(outelefilename, "%s.ele", filebasename);
  printf("Saving elements to %s\n", outelefilename);
  fout = fopen(outelefilename, "w");
  if (mesh_dim == 3) {
    fprintf(fout, "%d  %d  %d\n", numberoftetrahedra, numberofcorners,
            numberoftetrahedronattributes);
    for (i = 0; i < numberoftetrahedra; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < numberofcorners; j++) {
        fprintf(fout, "  %5d", tetrahedronlist[i * numberofcorners + j]);
      }
      for (j = 0; j < numberoftetrahedronattributes; j++) {
        fprintf(fout, "  %g",
          tetrahedronattributelist[i * numberoftetrahedronattributes + j]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Save a two-dimensional mesh.
    fprintf(fout, "%d  %d  %d\n",numberoftrifaces,3,trifacemarkerlist ? 1 : 0);
    for (i = 0; i < numberoftrifaces; i++) {
      fprintf(fout, "%d", i + firstnumber);
      for (j = 0; j < 3; j++) {
        fprintf(fout, "  %5d", trifacelist[i * 3 + j]);
      }
      if (trifacemarkerlist != NULL) {
        fprintf(fout, "  %d", trifacemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  }

  fclose(fout);
}